

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O2

void anon_unknown.dwarf_3964::modtest(int base,int test)

{
  ulong byteCount;
  bool bVar1;
  int iVar2;
  clock_t cVar3;
  clock_t cVar4;
  clock_t cVar5;
  clock_t cVar6;
  pointer pBVar7;
  undefined4 in_register_0000003c;
  pointer pBVar8;
  pointer pBVar9;
  int iVar10;
  vector<BN,_std::allocator<BN>_> g;
  vector<BN,_std::allocator<BN>_> mod;
  vector<BN,_std::allocator<BN>_> exp;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_d8;
  BN m;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_a8;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_90;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  g.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  g.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  g.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  byteCount = (ulong)(uint)base;
  iVar10 = 0;
  iVar2 = 0;
  if (0 < test) {
    iVar2 = test;
  }
LAB_001099c4:
  if (iVar10 == iVar2) {
    cVar3 = clock();
    pBVar7 = mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar9 = exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (pBVar8 = g.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        pBVar8 != g.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                  _M_finish; pBVar8 = pBVar8 + 1) {
      BN::PowMod((BN *)&local_60,pBVar8,pBVar9,pBVar7);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60);
      pBVar9 = pBVar9 + 1;
      pBVar7 = pBVar7 + 1;
    }
    cVar4 = clock();
    cVar5 = clock();
    pBVar7 = mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar9 = exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (pBVar8 = g.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        pBVar8 != g.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                  _M_finish; pBVar8 = pBVar8 + 1) {
      BN::PowModBarrett((BN *)&local_78,pBVar8,pBVar9,pBVar7);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_78);
      pBVar9 = pBVar9 + 1;
      pBVar7 = pBVar7 + 1;
    }
    cVar6 = clock();
    printf("%d\t%d\t%d\t%.2f\t\t%.2f\n",
           SUB84((double)((float)(ulong)(cVar4 - cVar3) / ((float)test * 1000.0)),0),
           (double)((float)(ulong)(cVar6 - cVar5) / ((float)test * 1000.0)),
           CONCAT44(in_register_0000003c,base),(ulong)(uint)(base * 8));
    std::vector<BN,_std::allocator<BN>_>::~vector(&mod);
    std::vector<BN,_std::allocator<BN>_>::~vector(&exp);
    std::vector<BN,_std::allocator<BN>_>::~vector(&g);
    return;
  }
  BN::makeRandom(&m,byteCount);
  std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&g,&m);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&m);
  BN::makeRandom(&m,byteCount);
  std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&exp,&m);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&m);
  BN::makeRandom(&m,byteCount);
  do {
    bVar1 = BN::is0(&m);
    if (!bVar1) {
      BN::BN((BN *)&local_d8,&m);
      BN::BN((BN *)&local_a8,0x10000);
      gcdBinary((BN *)&local_90,(BN *)&local_d8,(BN *)&local_a8);
      BN::BN((BN *)&local_48,1);
      bVar1 = BN::operator!=((BN *)&local_90,(BN *)&local_48);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_90);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_a8);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_d8);
      if (!bVar1) break;
    }
    BN::makeRandom((BN *)&local_90,byteCount);
    BN::operator=(&m,(BN *)&local_90);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_90);
  } while( true );
  std::vector<BN,_std::allocator<BN>_>::push_back(&mod,(value_type *)&m);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&m);
  iVar10 = iVar10 + 1;
  goto LAB_001099c4;
}

Assistant:

void modtest(int base,int test) {
    uint64_t t;
    vector <BN> g;
    vector <BN> exp;
    vector <BN> mod;


    for(int i=0;i<test;i++) {
        g.push_back(BN::makeRandom(base));
        exp.push_back(BN::makeRandom(base));
        BN m(BN::makeRandom(base));
        while (m.is0() || (gcdBinary(m, (BN)bsize) != (BN) 1))
            m = BN::makeRandom(base);
        mod.push_back( m );
    }

    t = clock();
    for(vector <BN> :: iterator i = g.begin(), j = exp.begin(), k = mod.begin(); i != g.end(); i++, j++, k++)
        i->PowMod(*j, *k);
    float t1 = clock() - t;

    t = clock();
    for(vector <BN> :: iterator i = g.begin(), j = exp.begin(), k = mod.begin(); i != g.end(); i++, j++, k++)
        i->PowModBarrett(*j, *k);
    float t2 = clock() - t;

    float diviser = 1000.0 * test;
    t1 /= diviser;
    t2 /= diviser;

    printf("%d\t%d\t%d\t%.2f\t\t%.2f\n",base,(int)(base*8),test, t1, t2);
}